

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

void getHighsNonVertexSolution
               (HighsOptions *options,HighsLp *lp,Int num_col,Int num_row,
               vector<double,_std::allocator<double>_> *rhs,
               vector<char,_std::allocator<char>_> *constraint_type,LpSolver *lps,
               HighsModelStatus model_status,HighsSolution *highs_solution)

{
  double *x_00;
  double *xu_00;
  double *y_00;
  int in_ECX;
  int in_EDX;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> slack;
  vector<double,_std::allocator<double>_> zu;
  vector<double,_std::allocator<double>_> *in_stack_00000140;
  vector<double,_std::allocator<double>_> zl;
  vector<double,_std::allocator<double>_> *in_stack_00000160;
  vector<double,_std::allocator<double>_> xu;
  vector<double,_std::allocator<double>_> *in_stack_00000180;
  vector<double,_std::allocator<double>_> xl;
  vector<double,_std::allocator<double>_> x;
  allocator_type *in_stack_fffffffffffffe20;
  vector<double,_std::allocator<double>_> *this;
  size_type in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  double *slack_00;
  double *xl_00;
  LpSolver *this_00;
  double *zl_00;
  double *in_stack_fffffffffffffee8;
  double local_f1 [4];
  undefined1 local_d1 [144];
  double local_41 [5];
  int local_18;
  int local_14;
  
  zl_00 = local_41;
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::allocator<double>::allocator((allocator<double> *)0x47e311);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20);
  std::allocator<double>::~allocator((allocator<double> *)0x47e33d);
  std::allocator<double>::allocator((allocator<double> *)0x47e362);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20);
  std::allocator<double>::~allocator((allocator<double> *)0x47e38e);
  std::allocator<double>::allocator((allocator<double> *)0x47e3b3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20);
  std::allocator<double>::~allocator((allocator<double> *)0x47e3df);
  std::allocator<double>::allocator((allocator<double> *)0x47e404);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20);
  std::allocator<double>::~allocator((allocator<double> *)0x47e430);
  x_00 = (double *)(long)local_14;
  this_00 = (LpSolver *)local_d1;
  std::allocator<double>::allocator((allocator<double> *)0x47e455);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20);
  std::allocator<double>::~allocator((allocator<double> *)0x47e481);
  xu_00 = (double *)(long)local_18;
  xl_00 = local_f1;
  std::allocator<double>::allocator((allocator<double> *)0x47e4a6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20);
  std::allocator<double>::~allocator((allocator<double> *)0x47e4d2);
  y_00 = (double *)(long)local_18;
  slack_00 = (double *)&stack0xfffffffffffffeef;
  std::allocator<double>::allocator((allocator<double> *)0x47e4f1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20);
  std::allocator<double>::~allocator((allocator<double> *)0x47e517);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x47e531);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x47e543);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x47e555);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x47e567);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x47e579);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x47e58b);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x47e59d);
  ipx::LpSolver::GetInteriorSolution
            (this_00,x_00,xl_00,xu_00,slack_00,y_00,zl_00,in_stack_fffffffffffffee8);
  this = (vector<double,_std::allocator<double>_> *)(local_d1 + 0x21);
  ipxSolutionToHighsSolution
            ((HighsOptions *)
             zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (HighsLp *)
             zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,in_stack_00000140,
             (vector<char,_std::allocator<char>_> *)
             zu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,
             zu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish._4_4_,
             (HighsInt)
             zu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish,in_stack_00000160,
             (vector<double,_std::allocator<double>_> *)
             xu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,(vector<double,_std::allocator<double>_> *)
                      xu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (vector<double,_std::allocator<double>_> *)
             xu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,in_stack_00000180,
             (HighsModelStatus)
             xl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,(HighsSolution *)
                      xl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return;
}

Assistant:

void getHighsNonVertexSolution(const HighsOptions& options, const HighsLp& lp,
                               const ipx::Int num_col, const ipx::Int num_row,
                               const std::vector<double>& rhs,
                               const std::vector<char>& constraint_type,
                               const ipx::LpSolver& lps,
                               const HighsModelStatus model_status,
                               HighsSolution& highs_solution) {
  // Get the interior solution (available if IPM was started).
  // GetInteriorSolution() returns the final IPM iterate, regardless if the
  // IPM terminated successfully or not. (Only in case of out-of-memory no
  // solution exists.)
  std::vector<double> x(num_col);
  std::vector<double> xl(num_col);
  std::vector<double> xu(num_col);
  std::vector<double> zl(num_col);
  std::vector<double> zu(num_col);
  std::vector<double> slack(num_row);
  std::vector<double> y(num_row);

  lps.GetInteriorSolution(x.data(), xl.data(), xu.data(), slack.data(),
                          y.data(), zl.data(), zu.data());

  ipxSolutionToHighsSolution(options, lp, rhs, constraint_type, num_col,
                             num_row, x, slack, y, zl, zu, model_status,
                             highs_solution);
}